

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::ImplementationArrayTestCase::test
          (ImplementationArrayTestCase *this)

{
  GLenum pname;
  reference data;
  value_type_conflict1 local_34;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> queryResult;
  GLint targetArrayLength;
  ImplementationArrayTestCase *this_local;
  
  (*this->m_verifier->_vptr_StateVerifier[5])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (ulong)this->m_testTargetLengthTargetName,(ulong)(uint)this->m_minValue);
  ApiCase::expectError(&this->super_ApiCase,0);
  queryResult.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ApiCase).super_CallLogWrapper,this->m_testTargetLengthTargetName,
             (GLint *)((long)&queryResult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4));
  ApiCase::expectError(&this->super_ApiCase,0);
  if (queryResult.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ != 0) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_30);
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_30,
               (long)queryResult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,&local_34);
    pname = this->m_testTargetName;
    data = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_30,0);
    glu::CallLogWrapper::glGetIntegerv(&(this->super_ApiCase).super_CallLogWrapper,pname,data);
    ApiCase::expectError(&this->super_ApiCase,0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyIntegerGreaterOrEqual(m_testCtx, m_testTargetLengthTargetName, m_minValue);
		expectError(GL_NO_ERROR);

		GLint targetArrayLength = 0;
		glGetIntegerv(m_testTargetLengthTargetName, &targetArrayLength);
		expectError(GL_NO_ERROR);

		if (targetArrayLength)
		{
			std::vector<GLint> queryResult;
			queryResult.resize(targetArrayLength, 0);

			glGetIntegerv(m_testTargetName, &queryResult[0]);
			expectError(GL_NO_ERROR);
		}
	}